

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O2

void __thiscall
duckdb::BinarySerializer::WriteDataPtr(BinarySerializer *this,const_data_ptr_t ptr,idx_t count)

{
  VarIntEncode<unsigned_long>(this,count);
  (**this->stream->_vptr_WriteStream)(this->stream,ptr,count);
  return;
}

Assistant:

void BinarySerializer::WriteDataPtr(const_data_ptr_t ptr, idx_t count) {
	VarIntEncode(static_cast<uint64_t>(count));
	WriteData(ptr, count);
}